

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_scan.hpp
# Opt level: O2

void duckdb::AlpScanPartial<float>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  AlpScanState<float> *this;
  ulong uVar2;
  ulong vector_size;
  ulong uVar3;
  
  this = (AlpScanState<float> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator*(&state->scan_state);
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  for (uVar3 = 0; uVar2 = scan_count - uVar3, uVar3 <= scan_count && uVar2 != 0;
      uVar3 = uVar3 + vector_size) {
    vector_size = 0x400 - (ulong)((uint)this->total_value_count & 0x3ff);
    if (uVar2 < vector_size) {
      vector_size = uVar2;
    }
    AlpScanState<float>::ScanVector<float,false>
              (this,(float *)(pdVar1 + uVar3 * 4 + result_offset * 4),vector_size);
  }
  return;
}

Assistant:

void AlpScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                    idx_t result_offset) {
	auto &scan_state = (AlpScanState<T> &)*state.scan_state;

	// Get the pointer to the result values
	auto current_result_ptr = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	current_result_ptr += result_offset;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		const auto remaining = scan_count - scanned;
		const idx_t to_scan = MinValue(remaining, scan_state.LeftInVector());

		scan_state.template ScanVector<T>(current_result_ptr + scanned, to_scan);
		scanned += to_scan;
	}
}